

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O3

void __thiscall
Move::Move(Move *this,Position *initialPosition,Position *lastPosition,NurseSolution *movedNurse,
          NurseSolution *tradedNurse)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar2 = *(undefined4 *)&initialPosition->field_0x4;
  uVar3 = *(undefined4 *)&initialPosition->shiftType;
  uVar4 = *(undefined4 *)((long)&initialPosition->shiftType + 4);
  (this->initialPosition).day = initialPosition->day;
  *(undefined4 *)&(this->initialPosition).field_0x4 = uVar2;
  *(undefined4 *)&(this->initialPosition).shiftType = uVar3;
  *(undefined4 *)((long)&(this->initialPosition).shiftType + 4) = uVar4;
  (this->initialPosition).skill._M_dataplus._M_p = (pointer)&(this->initialPosition).skill.field_2;
  pcVar1 = (initialPosition->skill)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->initialPosition).skill,pcVar1,
             pcVar1 + (initialPosition->skill)._M_string_length);
  uVar2 = *(undefined4 *)&lastPosition->field_0x4;
  uVar3 = *(undefined4 *)&lastPosition->shiftType;
  uVar4 = *(undefined4 *)((long)&lastPosition->shiftType + 4);
  (this->lastPosition).day = lastPosition->day;
  *(undefined4 *)&(this->lastPosition).field_0x4 = uVar2;
  *(undefined4 *)&(this->lastPosition).shiftType = uVar3;
  *(undefined4 *)((long)&(this->lastPosition).shiftType + 4) = uVar4;
  (this->lastPosition).skill._M_dataplus._M_p = (pointer)&(this->lastPosition).skill.field_2;
  pcVar1 = (lastPosition->skill)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->lastPosition).skill,pcVar1,
             pcVar1 + (lastPosition->skill)._M_string_length);
  this->movedNurse = movedNurse;
  this->tradedNurse = tradedNurse;
  return;
}

Assistant:

Move::Move(Position initialPosition,Position lastPosition, NurseSolution* movedNurse, NurseSolution* tradedNurse) : initialPosition(initialPosition), lastPosition(lastPosition), movedNurse(movedNurse) , tradedNurse(tradedNurse){}